

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasn_dec.cc
# Opt level: O0

int asn1_template_noexp_d2i
              (ASN1_VALUE **val,uchar **in,long len,ASN1_TEMPLATE *tt,char opt,CRYPTO_BUFFER *buf,
              int depth)

{
  uchar *puVar1;
  int iVar2;
  stack_st_ASN1_VALUE *psVar3;
  size_t sVar4;
  uchar *q;
  ASN1_VALUE *skfield;
  ASN1_VALUE *vtmp;
  stack_st_ASN1_VALUE *sktmp;
  int local_58;
  int skaclass;
  int sktag;
  uint32_t flags;
  uchar *p;
  int ret;
  int aclass;
  CRYPTO_BUFFER *buf_local;
  ASN1_TEMPLATE *pAStack_30;
  char opt_local;
  ASN1_TEMPLATE *tt_local;
  long len_local;
  uchar **in_local;
  ASN1_VALUE **val_local;
  
  if (val == (ASN1_VALUE **)0x0) {
    return 0;
  }
  skaclass = tt->flags;
  p._4_4_ = skaclass & 0xc0;
  _sktag = *in;
  _ret = buf;
  buf_local._7_1_ = opt;
  pAStack_30 = (ASN1_TEMPLATE *)tt;
  tt_local = (ASN1_TEMPLATE *)len;
  len_local = (long)in;
  in_local = (uchar **)val;
  if ((skaclass & 6U) == 0) {
    if ((skaclass & 8U) == 0) {
      p._0_4_ = asn1_item_ex_d2i(val,(uchar **)&sktag,len,tt->item,-1,0,opt,buf,depth);
      if ((int)p != 0) {
        if ((int)p == -1) {
          return -1;
        }
        goto LAB_002f3dc0;
      }
      ERR_put_error(0xc,0,0x9e,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_dec.cc"
                    ,600);
    }
    else {
      p._0_4_ = asn1_item_ex_d2i(val,(uchar **)&sktag,len,tt->item,tt->tag,p._4_4_,opt,buf,depth);
      if ((int)p != 0) {
        if ((int)p == -1) {
          return -1;
        }
LAB_002f3dc0:
        *(uchar **)len_local = _sktag;
        return 1;
      }
      ERR_put_error(0xc,0,0x9e,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_dec.cc"
                    ,0x24e);
    }
  }
  else {
    if ((skaclass & 8U) == 0) {
      sktmp._4_4_ = 0;
      if ((skaclass & 2U) == 0) {
        local_58 = 0x10;
      }
      else {
        local_58 = 0x11;
      }
    }
    else {
      local_58 = tt->tag;
      sktmp._4_4_ = p._4_4_;
    }
    p._0_4_ = asn1_check_tlen((long *)&tt_local,(int *)0x0,(uchar *)0x0,(char *)0x0,(uchar **)&sktag
                              ,len,local_58,sktmp._4_4_,opt);
    if ((int)p == 0) {
      ERR_put_error(0xc,0,0x9e,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_dec.cc"
                    ,0x224);
      return 0;
    }
    if ((int)p == -1) {
      return -1;
    }
    if (*in_local == (uchar *)0x0) {
      psVar3 = sk_ASN1_VALUE_new_null();
      *in_local = (uchar *)psVar3;
    }
    else {
      vtmp = (ASN1_VALUE *)*in_local;
      while (sVar4 = sk_ASN1_VALUE_num((stack_st_ASN1_VALUE *)vtmp), sVar4 != 0) {
        skfield = sk_ASN1_VALUE_pop((stack_st_ASN1_VALUE *)vtmp);
        ASN1_item_ex_free((ASN1_VALUE **)&skfield,(ASN1_ITEM *)pAStack_30->field_name);
      }
    }
    if (*in_local != (uchar *)0x0) {
      do {
        puVar1 = _sktag;
        if ((long)tt_local < 1) goto LAB_002f3dc0;
        q = (uchar *)0x0;
        iVar2 = asn1_item_ex_d2i((ASN1_VALUE **)&q,(uchar **)&sktag,(long)tt_local,
                                 (ASN1_ITEM *)pAStack_30->field_name,-1,0,'\0',_ret,depth);
        if (iVar2 == 0) {
          ERR_put_error(0xc,0,0x9e,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_dec.cc"
                        ,0x240);
          goto LAB_002f3dd4;
        }
        tt_local = (ASN1_TEMPLATE *)((long)tt_local - ((long)_sktag - (long)puVar1));
        sVar4 = sk_ASN1_VALUE_push((stack_st_ASN1_VALUE *)*in_local,(ASN1_VALUE *)q);
      } while (sVar4 != 0);
      ASN1_item_ex_free((ASN1_VALUE **)&q,(ASN1_ITEM *)pAStack_30->field_name);
    }
  }
LAB_002f3dd4:
  ASN1_template_free((ASN1_VALUE **)in_local,pAStack_30);
  return 0;
}

Assistant:

static int asn1_template_noexp_d2i(ASN1_VALUE **val, const unsigned char **in,
                                   long len, const ASN1_TEMPLATE *tt, char opt,
                                   CRYPTO_BUFFER *buf, int depth) {
  int aclass;
  int ret;
  const unsigned char *p;
  if (!val) {
    return 0;
  }
  uint32_t flags = tt->flags;
  aclass = flags & ASN1_TFLG_TAG_CLASS;

  p = *in;

  if (flags & ASN1_TFLG_SK_MASK) {
    // SET OF, SEQUENCE OF
    int sktag, skaclass;
    // First work out expected inner tag value
    if (flags & ASN1_TFLG_IMPTAG) {
      sktag = tt->tag;
      skaclass = aclass;
    } else {
      skaclass = V_ASN1_UNIVERSAL;
      if (flags & ASN1_TFLG_SET_OF) {
        sktag = V_ASN1_SET;
      } else {
        sktag = V_ASN1_SEQUENCE;
      }
    }
    // Get the tag
    ret =
        asn1_check_tlen(&len, NULL, NULL, NULL, &p, len, sktag, skaclass, opt);
    if (!ret) {
      OPENSSL_PUT_ERROR(ASN1, ASN1_R_NESTED_ASN1_ERROR);
      return 0;
    } else if (ret == -1) {
      return -1;
    }
    if (!*val) {
      *val = (ASN1_VALUE *)sk_ASN1_VALUE_new_null();
    } else {
      // We've got a valid STACK: free up any items present
      STACK_OF(ASN1_VALUE) *sktmp = (STACK_OF(ASN1_VALUE) *)*val;
      ASN1_VALUE *vtmp;
      while (sk_ASN1_VALUE_num(sktmp) > 0) {
        vtmp = sk_ASN1_VALUE_pop(sktmp);
        ASN1_item_ex_free(&vtmp, ASN1_ITEM_ptr(tt->item));
      }
    }

    if (!*val) {
      goto err;
    }

    // Read as many items as we can
    while (len > 0) {
      ASN1_VALUE *skfield;
      const unsigned char *q = p;
      skfield = NULL;
      if (!asn1_item_ex_d2i(&skfield, &p, len, ASN1_ITEM_ptr(tt->item),
                            /*tag=*/-1, /*aclass=*/0, /*opt=*/0, buf, depth)) {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_NESTED_ASN1_ERROR);
        goto err;
      }
      len -= p - q;
      if (!sk_ASN1_VALUE_push((STACK_OF(ASN1_VALUE) *)*val, skfield)) {
        ASN1_item_ex_free(&skfield, ASN1_ITEM_ptr(tt->item));
        goto err;
      }
    }
  } else if (flags & ASN1_TFLG_IMPTAG) {
    // IMPLICIT tagging
    ret = asn1_item_ex_d2i(val, &p, len, ASN1_ITEM_ptr(tt->item), tt->tag,
                           aclass, opt, buf, depth);
    if (!ret) {
      OPENSSL_PUT_ERROR(ASN1, ASN1_R_NESTED_ASN1_ERROR);
      goto err;
    } else if (ret == -1) {
      return -1;
    }
  } else {
    // Nothing special
    ret = asn1_item_ex_d2i(val, &p, len, ASN1_ITEM_ptr(tt->item), /*tag=*/-1,
                           /*aclass=*/0, opt, buf, depth);
    if (!ret) {
      OPENSSL_PUT_ERROR(ASN1, ASN1_R_NESTED_ASN1_ERROR);
      goto err;
    } else if (ret == -1) {
      return -1;
    }
  }

  *in = p;
  return 1;

err:
  ASN1_template_free(val, tt);
  return 0;
}